

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

QModelIndex * __thiscall
QColumnView::indexAt(QModelIndex *__return_storage_ptr__,QColumnView *this,QPoint *point)

{
  long lVar1;
  long *plVar2;
  bool bVar3;
  int i;
  ulong uVar4;
  long in_FS_OFFSET;
  QRect QVar5;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  uVar4 = 0;
  do {
    if (*(ulong *)(lVar1 + 0x550) <= uVar4) {
      __return_storage_ptr__->r = -1;
      __return_storage_ptr__->c = -1;
      __return_storage_ptr__->i = 0;
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
      break;
    }
    QVar5 = QWidget::frameGeometry(*(QWidget **)(*(long *)(lVar1 + 0x548) + uVar4 * 8));
    local_40 = (point->xp).m_i - QVar5.x1.m_i;
    local_3c = (point->yp).m_i - QVar5.y1.m_i;
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    __return_storage_ptr__->r = -0x55555556;
    __return_storage_ptr__->c = -0x55555556;
    *(undefined4 *)&__return_storage_ptr__->i = 0xaaaaaaaa;
    *(undefined4 *)((long)&__return_storage_ptr__->i + 4) = 0xaaaaaaaa;
    plVar2 = *(long **)(*(long *)(lVar1 + 0x548) + uVar4 * 8);
    (**(code **)(*plVar2 + 0x1f0))(__return_storage_ptr__,plVar2,&local_40);
    bVar3 = QModelIndex::isValid(__return_storage_ptr__);
    uVar4 = uVar4 + 1;
  } while (!bVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndex QColumnView::indexAt(const QPoint &point) const
{
    Q_D(const QColumnView);
    for (int i = 0; i < d->columns.size(); ++i) {
        QPoint topLeft = d->columns.at(i)->frameGeometry().topLeft();
        QPoint adjustedPoint(point.x() - topLeft.x(), point.y() - topLeft.y());
        QModelIndex index = d->columns.at(i)->indexAt(adjustedPoint);
        if (index.isValid())
            return index;
    }
    return QModelIndex();
}